

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

float ldamath::fastlog2(float x)

{
  float fVar1;
  float y;
  uint32_t vx;
  float mx_f;
  uint32_t mx;
  float x_local;
  
  fVar1 = (float)((uint)x & 0x7fffff | 0x3f000000);
  return (fVar1 * -1.4980303 + ((float)(uint)x * 1.1920929e-07 - 124.22545)) -
         1.72588 / (fVar1 + 0.35208872);
}

Assistant:

inline float fastlog2(float x)
{
  uint32_t mx;
  memcpy(&mx, &x, sizeof(uint32_t));
  mx = (mx & 0x007FFFFF) | (0x7e << 23);

  float mx_f;
  memcpy(&mx_f, &mx, sizeof(float));

  uint32_t vx;
  memcpy(&vx, &x, sizeof(uint32_t));

  float y = static_cast<float>(vx);
  y *= 1.0f / (float)(1 << 23);

  return y - 124.22544637f - 1.498030302f * mx_f - 1.72587999f / (0.3520887068f + mx_f);
}